

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::UniformCase::~UniformCase(UniformCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_00c1bd10;
  deinit(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_filledTextureUnits).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::~_Vector_base
            (&(this->m_texturesCube).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>);
  std::_Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::~_Vector_base
            (&(this->m_textures2d).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>);
  de::SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>::~SharedPtr
            (&this->m_uniformCollection);
  glu::CallLogWrapper::~CallLogWrapper(&this->super_CallLogWrapper);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

UniformCase::~UniformCase (void)
{
	UniformCase::deinit();
}